

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryExpanderRenderTest::init
          (GeometryExpanderRenderTest *this,EVP_PKEY_CTX *ctx)

{
  GeometryShaderInputType inputType;
  GeometryShaderOutputType outputType;
  int iVar1;
  VertexExpanderShader *this_00;
  EVP_PKEY_CTX *ctx_00;
  int local_1c;
  
  this_00 = (VertexExpanderShader *)operator_new(0x158);
  local_1c = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[2])();
  inputType = sglr::rr_util::mapGLGeometryShaderInputType
                        ((this->super_GeometryShaderRenderTest).m_inputPrimitives);
  outputType = sglr::rr_util::mapGLGeometryShaderOutputType
                         ((this->super_GeometryShaderRenderTest).m_outputPrimitives);
  ctx_00 = (EVP_PKEY_CTX *)&local_1c;
  VertexExpanderShader::VertexExpanderShader(this_00,(ContextType *)ctx_00,inputType,outputType);
  this->m_program = this_00;
  iVar1 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar1;
}

Assistant:

void GeometryExpanderRenderTest::init (void)
{
	m_program = new VertexExpanderShader(m_context.getRenderContext().getType(), sglr::rr_util::mapGLGeometryShaderInputType(m_inputPrimitives), sglr::rr_util::mapGLGeometryShaderOutputType(m_outputPrimitives));

	GeometryShaderRenderTest::init();
}